

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QPointer<QMdiSubWindow>,QPointer<QMdiSubWindow>>
                    (QList<QPointer<QMdiSubWindow>_> *vector,QPointer<QMdiSubWindow> *u,
                    qsizetype from)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  qsizetype qVar6;
  QPointer<QMdiSubWindow> *lhs;
  long lVar7;
  
  uVar1 = (vector->d).size;
  uVar4 = from;
  if (from < 0) {
    uVar4 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar4 = 0;
    }
  }
  qVar6 = -1;
  if (uVar4 < uVar1) {
    lhs = (vector->d).ptr + uVar4;
    lVar7 = uVar1 * 0x10 + uVar4 * -0x10;
    lVar2 = 0x10 - (long)lhs;
    do {
      lVar5 = lVar2;
      if (lVar7 == 0) {
        return -1;
      }
      bVar3 = comparesEqual<QMdiSubWindow>(lhs,u);
      lhs = lhs + 1;
      lVar7 = lVar7 + -0x10;
      lVar2 = lVar5 + -0x10;
    } while (!bVar3);
    qVar6 = -((long)&(vector->d).ptr[-1].wp.d + lVar5) >> 4;
  }
  return qVar6;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}